

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ClockingSkew __thiscall
slang::ast::ClockingBlockSymbol::getDefaultOutputSkew(ClockingBlockSymbol *this)

{
  bool bVar1;
  AssertionInstanceDetails *scope_00;
  ClockingSkew *pCVar2;
  LookupLocation LVar3;
  ClockingSkew CVar4;
  ClockingSkew local_98;
  bitmask<slang::ast::ASTFlags> local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  undefined1 local_60 [8];
  ASTContext context;
  Scope *scope;
  ClockingBlockSymbol *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->defaultOutputSkew);
  if (!bVar1) {
    if (this->outputSkewSyntax == (ClockingSkewSyntax *)0x0) {
      std::optional<slang::ast::ClockingSkew>::emplace<>(&this->defaultOutputSkew);
    }
    else {
      scope_00 = (AssertionInstanceDetails *)Symbol::getParentScope(&this->super_Symbol);
      context.assertionInstance = scope_00;
      if (scope_00 == (AssertionInstanceDetails *)0x0) {
        assert::assertFailed
                  ("scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x4fe,
                   "ClockingSkew slang::ast::ClockingBlockSymbol::getDefaultOutputSkew() const");
      }
      LVar3 = LookupLocation::before(&this->super_Symbol);
      local_80 = LVar3.scope;
      local_78 = LVar3.index;
      local_70 = local_80;
      local_68 = local_78;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_88,None);
      LVar3.index = local_68;
      LVar3.scope = local_70;
      LVar3._12_4_ = 0;
      ASTContext::ASTContext((ASTContext *)local_60,(Scope *)scope_00,LVar3,local_88);
      CVar4 = ClockingSkew::fromSyntax(this->outputSkewSyntax,(ASTContext *)local_60);
      local_98.delay = CVar4.delay;
      local_98.edge = CVar4.edge;
      std::optional<slang::ast::ClockingSkew>::operator=(&this->defaultOutputSkew,&local_98);
    }
  }
  pCVar2 = std::optional<slang::ast::ClockingSkew>::operator*(&this->defaultOutputSkew);
  CVar4._0_8_ = *(ulong *)pCVar2 & 0xffffffff;
  CVar4.delay = pCVar2->delay;
  return CVar4;
}

Assistant:

ClockingSkew ClockingBlockSymbol::getDefaultOutputSkew() const {
    if (!defaultOutputSkew) {
        if (outputSkewSyntax) {
            auto scope = getParentScope();
            ASSERT(scope);

            ASTContext context(*scope, LookupLocation::before(*this));
            defaultOutputSkew = ClockingSkew::fromSyntax(*outputSkewSyntax, context);
        }
        else {
            defaultOutputSkew.emplace();
        }
    }
    return *defaultOutputSkew;
}